

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

string_type * __thiscall
toml::detail::serializer<toml::type_config>::operator()
          (serializer<toml::type_config> *this,string_type *s,string_format_info *fmt,
          source_location *loc)

{
  bool bVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __a;
  serialization_error *this_00;
  undefined8 uVar2;
  undefined1 *in_RCX;
  char *in_RDX;
  string_type *in_RDI;
  string_type *retval;
  undefined7 in_stack_fffffffffffffb98;
  char in_stack_fffffffffffffb9f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffbb0;
  source_location *psVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffbb8;
  serialization_error *in_stack_fffffffffffffbc0;
  allocator<char> *in_stack_fffffffffffffbd0;
  string_type *this_01;
  string *in_stack_fffffffffffffd28;
  source_location *in_stack_fffffffffffffd30;
  serializer<toml::type_config> *in_stack_fffffffffffffd38;
  string_type *in_stack_fffffffffffffd90;
  serializer<toml::type_config> *in_stack_fffffffffffffd98;
  source_location local_171;
  char *local_90;
  undefined1 local_81;
  char *local_80;
  char *local_78;
  char *local_70;
  undefined1 local_29;
  undefined1 *local_20;
  
  local_29 = 0;
  this_01 = in_RDI;
  local_20 = in_RCX;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbb0._M_current);
  switch(*local_20) {
  case 0:
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_fffffffffffffba0,in_stack_fffffffffffffb9f);
    escape_basic_string(in_stack_fffffffffffffd38,(string_type *)in_stack_fffffffffffffd30);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_fffffffffffffba0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98));
    std::__cxx11::string::~string(in_stack_fffffffffffffba0);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_fffffffffffffba0,in_stack_fffffffffffffb9f);
    break;
  case 1:
    local_78 = (char *)CLI::std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98));
    local_80 = (char *)CLI::std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                 (in_stack_fffffffffffffba8);
    local_81 = 10;
    __a = std::find<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                    (in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
                     (char *)in_stack_fffffffffffffba8);
    local_70 = __a._M_current;
    local_90 = (char *)CLI::std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                 (in_stack_fffffffffffffba8);
    bVar1 = __gnu_cxx::
            operator==<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffba0,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98));
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      this_00 = (serialization_error *)__cxa_allocate_exception(0xa0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,in_RDX
                 ,(allocator<char> *)__a._M_current);
      source_location::source_location
                ((source_location *)this_00,(source_location *)in_stack_fffffffffffffbb8._M_current)
      ;
      psVar3 = &local_171;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,in_RDX
                 ,(allocator<char> *)__a._M_current);
      format_error<>((string *)in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
                     in_stack_fffffffffffffd28);
      source_location::source_location((source_location *)this_00,psVar3);
      serialization_error::serialization_error
                (this_00,(string *)psVar3,(source_location *)in_stack_fffffffffffffbb0._M_current);
      __cxa_throw(this_00,&serialization_error::typeinfo,serialization_error::~serialization_error);
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_fffffffffffffba0,in_stack_fffffffffffffb9f);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_fffffffffffffba0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_fffffffffffffba0,in_stack_fffffffffffffb9f);
    break;
  case 2:
    string_conv<std::__cxx11::string,4ul>
              ((char (*) [4])CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_fffffffffffffba0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98));
    std::__cxx11::string::~string(in_stack_fffffffffffffba0);
    if ((local_20[1] & 1) != 0) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=(in_stack_fffffffffffffba0,in_stack_fffffffffffffb9f);
    }
    escape_ml_basic_string(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_fffffffffffffba0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98));
    std::__cxx11::string::~string(in_stack_fffffffffffffba0);
    string_conv<std::__cxx11::string,4ul>
              ((char (*) [4])CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_fffffffffffffba0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98));
    std::__cxx11::string::~string(in_stack_fffffffffffffba0);
    break;
  case 3:
    string_conv<std::__cxx11::string,4ul>
              ((char (*) [4])CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_fffffffffffffba0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98));
    std::__cxx11::string::~string(in_stack_fffffffffffffba0);
    if ((local_20[1] & 1) != 0) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=(in_stack_fffffffffffffba0,in_stack_fffffffffffffb9f);
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_fffffffffffffba0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98));
    string_conv<std::__cxx11::string,4ul>
              ((char (*) [4])CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_fffffffffffffba0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98));
    std::__cxx11::string::~string(in_stack_fffffffffffffba0);
    break;
  default:
    uVar2 = __cxa_allocate_exception(0xa0);
    psVar3 = (source_location *)&stack0xfffffffffffffd27;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,in_RDX,
               in_stack_fffffffffffffbd0);
    source_location::source_location
              ((source_location *)in_stack_fffffffffffffbc0,
               (source_location *)in_stack_fffffffffffffbb8._M_current);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,in_RDX,
               in_stack_fffffffffffffbd0);
    format_error<>((string *)in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
                   in_stack_fffffffffffffd28);
    source_location::source_location
              ((source_location *)in_stack_fffffffffffffbc0,
               (source_location *)in_stack_fffffffffffffbb8._M_current);
    serialization_error::serialization_error
              (in_stack_fffffffffffffbc0,(string *)in_stack_fffffffffffffbb8._M_current,psVar3);
    __cxa_throw(uVar2,&serialization_error::typeinfo,serialization_error::~serialization_error);
  }
  return in_RDI;
}

Assistant:

string_type operator()(string_type s, const string_format_info& fmt, const source_location& loc) // {{{
    {
        string_type retval;
        switch(fmt.fmt)
        {
            case string_format::basic:
            {
                retval += char_type('"');
                retval += this->escape_basic_string(s);
                retval += char_type('"');
                return retval;
            }
            case string_format::literal:
            {
                if(std::find(s.begin(), s.end(), char_type('\n')) != s.end())
                {
                    throw serialization_error(format_error("toml::serializer: "
                        "(non-multiline) literal string cannot have a newline",
                        loc, "here"), loc);
                }
                retval += char_type('\'');
                retval += s;
                retval += char_type('\'');
                return retval;
            }
            case string_format::multiline_basic:
            {
                retval += string_conv<string_type>("\"\"\"");
                if(fmt.start_with_newline)
                {
                    retval += char_type('\n');
                }

                retval += this->escape_ml_basic_string(s);

                retval += string_conv<string_type>("\"\"\"");
                return retval;
            }
            case string_format::multiline_literal:
            {
                retval += string_conv<string_type>("'''");
                if(fmt.start_with_newline)
                {
                    retval += char_type('\n');
                }
                retval += s;
                retval += string_conv<string_type>("'''");
                return retval;
            }
            default:
            {
                throw serialization_error(format_error(
                    "[error] toml::serializer::operator()(string): "
                    "invalid string_format value", loc, "here"), loc);
            }
        }
    }